

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzer.cpp
# Opt level: O2

void __thiscall MidiAnalyzer::WorkerThread(MidiAnalyzer *this)

{
  MidiAnalyzerResults *pMVar1;
  U32 UVar2;
  int iVar3;
  MarkerType MVar4;
  int iVar5;
  AnalyzerChannelData *pAVar6;
  MidiAnalyzer *this_00;
  byte mData;
  byte bVar8;
  bool bVar9;
  MidiFrameType FrameType;
  stash stash1;
  long local_68;
  undefined8 local_60;
  Frame frame;
  byte bVar7;
  
  UVar2 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar2;
  pAVar6 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSerial = pAVar6;
  iVar3 = AnalyzerChannelData::GetBitState();
  if (iVar3 == 0) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  local_68 = (long)(((double)this->mSampleRateHz * 1.5) /
                   (double)((this->mSettings)._M_ptr)->mBitRate);
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    local_60 = AnalyzerChannelData::GetSampleNumber();
    this_00 = (MidiAnalyzer *)this->mSerial;
    AnalyzerChannelData::Advance((uint)this_00);
    bVar8 = 1;
    mData = 0;
    iVar3 = 8;
    while (bVar9 = iVar3 != 0, iVar3 = iVar3 + -1, bVar9) {
      pMVar1 = (this->mResults)._M_ptr;
      MVar4 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddMarker((ulonglong)pMVar1,MVar4,(Channel *)0x0);
      iVar5 = AnalyzerChannelData::GetBitState();
      bVar7 = 0;
      if (iVar5 == 1) {
        bVar7 = bVar8;
      }
      mData = bVar7 | mData;
      this_00 = (MidiAnalyzer *)this->mSerial;
      AnalyzerChannelData::Advance((uint)this_00);
      bVar8 = bVar8 * '\x02';
    }
    FrameType = error;
    stash1.channel = -8;
    if ((char)mData < '\0') {
      if (mData < 0xf0) {
        channelMessage(this,mData,&FrameType,&stash1);
        this->distanceFromLastCommandPacket = 0;
      }
      else {
        systemMessage(this_00,mData,&FrameType,&stash1);
      }
    }
    else {
      dataParameter(this,'\0',&FrameType,&stash1);
    }
    Frame::Frame(&frame);
    _frame = local_60;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
    AnalyzerResults::CommitResults();
    Analyzer::ReportProgress((ulonglong)this);
    if (this->distanceFromLastCommandPacket != -1) {
      this->distanceFromLastCommandPacket = this->distanceFromLastCommandPacket + 1;
    }
    Frame::~Frame(&frame);
  } while( true );
}

Assistant:

void MidiAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();

    mSerial = GetAnalyzerChannelData( mSettings->mInputChannel );

    if( mSerial->GetBitState() == BIT_LOW )
        mSerial->AdvanceToNextEdge();

    // double Stop_Bits = mSettings->mStopBits;
    unsigned short DataBits = 8; // FIXME
    bool BigEndian = false;      // FIXME
    /*
     * Big endian / Little endian.
     * 31.25 kBaud, 1 start, 8 data, 1 stop bit.
     * Asynchronous
     */

    U32 samples_per_bit = mSampleRateHz / mSettings->mBitRate;
    U32 samples_to_first_center_of_first_data_bit = U32( 1.5 * double( mSampleRateHz ) / double( mSettings->mBitRate ) );
    // U8 dataQueue[5];				// Storage for previous frames, arranged in a FIFO.
    // memset( &dataQueue, 0, sizeof(dataQueue) );	// clear it.

    for( ;; )
    {
        U8 data = 0;
        U8 mask = 0;

        if( BigEndian )
            mask = 1 << 7;
        else
            mask = 1;

        enum MidiFrameType FrameType;
        union stash stash1;

        mSerial->AdvanceToNextEdge(); // falling edge -- beginning of the start bit
        U64 starting_sample = mSerial->GetSampleNumber();
        mSerial->Advance( samples_to_first_center_of_first_data_bit );

        for( U32 i = 0; i < DataBits; i++ )
        { // Read in data.
            // let's put a dot exactly where we sample this bit:
            mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::Dot, mSettings->mInputChannel );
            if( mSerial->GetBitState() == BIT_HIGH )
            {
                data |= mask;
            }
            mSerial->Advance( samples_per_bit );

            if( BigEndian )
                mask = mask >> 1;
            else
                mask = mask << 1;
        }

        // Set defaults, debugging aid.
        FrameType = error;
        stash1.channel = -8;

        // Determine if data is a DATA byte or a COMMAND byte.
        if( data >= 0x80 )
        { // COMMAND byte.  Data has the MSB clear, Command bytes have it set.
            if( ( data & 0xF0 ) == 0xF0 )
            { // All system messages have 0xF in the high nibble.
                systemMessage( data, &FrameType, &stash1 );
            }
            else
            {
                channelMessage( data, &FrameType, &stash1 );
                distanceFromLastCommandPacket = 0;
            }
        }
        else
        { // DATA byte
            dataParameter( data, &FrameType, &stash1 );
        }

        // we have a byte to save.
        Frame frame;
        frame.mData1 = data;
        frame.mData2 = stash1.mData2;
        frame.mType = FrameType;
        frame.mFlags = 0;
        frame.mStartingSampleInclusive = starting_sample;
        frame.mEndingSampleInclusive = mSerial->GetSampleNumber();

        mResults->AddFrame( frame );
        mResults->CommitResults();
        ReportProgress( frame.mEndingSampleInclusive );

        if( distanceFromLastCommandPacket != -1 )
        {
            distanceFromLastCommandPacket++;
        }
    }
}